

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.cc
# Opt level: O3

void __thiscall gutil::PropertyNode::saveOctave(PropertyNode *this,ostream *out)

{
  size_type sVar1;
  char cVar2;
  ostream *poVar3;
  pointer psVar4;
  long *plVar5;
  pointer psVar6;
  int i;
  long lVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  char *vp;
  istringstream in;
  DMatrix<double> local_1f8;
  DMatrix<double> local_1e0;
  DMatrix<double> local_1c8;
  char *local_1b0;
  istringstream local_1a8 [120];
  ios_base local_130 [264];
  
  psVar6 = (this->list).
           super__Vector_base<std::shared_ptr<gutil::PropertyNode>,_std::allocator<std::shared_ptr<gutil::PropertyNode>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  sVar1 = (this->name)._M_string_length;
  psVar4 = (this->list).
           super__Vector_base<std::shared_ptr<gutil::PropertyNode>,_std::allocator<std::shared_ptr<gutil::PropertyNode>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  cVar2 = (char)out;
  if (psVar6 != psVar4) {
    if (sVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(out,"# name: ",8);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,(this->name)._M_dataplus._M_p,(this->name)._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(out,"# type: scalar struct",0x15);
      std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(out,"# ndims: 2",10);
      std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(out,"  1 1",5);
      std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(out,"# length: ",10);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)out);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      psVar4 = (this->list).
               super__Vector_base<std::shared_ptr<gutil::PropertyNode>,_std::allocator<std::shared_ptr<gutil::PropertyNode>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar6 = (this->list).
               super__Vector_base<std::shared_ptr<gutil::PropertyNode>,_std::allocator<std::shared_ptr<gutil::PropertyNode>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    if (psVar6 != psVar4) {
      lVar10 = 0;
      uVar8 = 0;
      do {
        saveOctave(*(PropertyNode **)
                    ((long)&(psVar4->
                            super___shared_ptr<gutil::PropertyNode,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr + lVar10),out);
        uVar8 = uVar8 + 1;
        psVar4 = (this->list).
                 super__Vector_base<std::shared_ptr<gutil::PropertyNode>,_std::allocator<std::shared_ptr<gutil::PropertyNode>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar10 = lVar10 + 0x10;
      } while (uVar8 < (ulong)((long)(this->list).
                                     super__Vector_base<std::shared_ptr<gutil::PropertyNode>,_std::allocator<std::shared_ptr<gutil::PropertyNode>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)psVar4 >> 4)
              );
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
    return;
  }
  if ((sVar1 != 0) && ((this->value)._M_string_length != 0)) {
    local_1b0 = (char *)0x0;
    strtod((this->value)._M_dataplus._M_p,&local_1b0);
    if (*local_1b0 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>(out,"# name: ",8);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,(this->name)._M_dataplus._M_p,(this->name)._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(out,"# type: scalar",0xe);
      std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,(this->value)._M_dataplus._M_p,(this->value)._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
    }
    else {
      local_1f8.v = (double *)0x0;
      local_1f8.nrows = 0;
      local_1f8.ncols = 0;
      local_1f8.n = 0;
      std::__cxx11::istringstream::istringstream(local_1a8,(string *)&this->value,_S_in);
      gmath::operator>>((basic_istream<char,_std::char_traits<char>_> *)local_1a8,&local_1f8);
      if (0 < local_1f8.nrows) {
        lVar10 = (long)local_1f8.ncols;
        if (0 < lVar10) {
          if (local_1f8.nrows == 1) {
            local_1e0.nrows = 1;
            local_1e0.ncols = local_1f8.ncols;
            local_1e0.n = local_1f8.ncols;
            local_1e0.v = (double *)operator_new__(lVar10 * 8);
            lVar7 = 0;
            do {
              local_1e0.v[lVar7] = local_1f8.v[lVar7];
              lVar7 = lVar7 + 1;
            } while (lVar10 != lVar7);
            gmath::transpose<double>(&local_1c8,&local_1e0);
            gmath::DMatrix<double>::operator=(&local_1f8,&local_1c8);
            if (local_1c8.v != (double *)0x0) {
              operator_delete__(local_1c8.v);
            }
            if (local_1e0.v != (double *)0x0) {
              operator_delete__(local_1e0.v);
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>(out,"# name: ",8);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             (out,(this->name)._M_dataplus._M_p,(this->name)._M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>(out,"# type: matrix",0xe);
          std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
          std::ostream::put(cVar2);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>(out,"# rows: ",8);
          plVar5 = (long *)std::ostream::operator<<((ostream *)out,local_1f8.nrows);
          std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
          std::ostream::put((char)plVar5);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>(out,"# columns: ",0xb);
          plVar5 = (long *)std::ostream::operator<<((ostream *)out,local_1f8.ncols);
          std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
          std::ostream::put((char)plVar5);
          std::ostream::flush();
          lVar10 = *(long *)out;
          *(undefined8 *)(out + *(long *)(lVar10 + -0x18) + 8) = 0x10;
          if (0 < local_1f8.nrows) {
            iVar9 = 0;
            do {
              if (0 < local_1f8.ncols) {
                lVar10 = 0;
                do {
                  local_1e0.nrows = CONCAT31(local_1e0.nrows._1_3_,0x20);
                  std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_1e0,1);
                  std::ostream::_M_insert<double>
                            (local_1f8.v[(long)local_1f8.ncols * (long)iVar9 + lVar10]);
                  lVar10 = lVar10 + 1;
                } while ((int)lVar10 < local_1f8.ncols);
              }
              std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
              std::ostream::put(cVar2);
              std::ostream::flush();
              iVar9 = iVar9 + 1;
            } while (iVar9 < local_1f8.nrows);
            lVar10 = *(long *)out;
          }
          std::ios::widen((char)*(undefined8 *)(lVar10 + -0x18) + cVar2);
          std::ostream::put(cVar2);
          std::ostream::flush();
          std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
          std::ostream::put(cVar2);
          std::ostream::flush();
        }
      }
      std::__cxx11::istringstream::~istringstream(local_1a8);
      std::ios_base::~ios_base(local_130);
      if (local_1f8.v != (double *)0x0) {
        operator_delete__(local_1f8.v);
      }
    }
  }
  return;
}

Assistant:

void saveOctave(std::ostream &out) const
    {
      if (list.size() > 0)
      {
        if (name.size() > 0)
        {
          // add structure element
          out << "# name: " << name << std::endl;
          out << "# type: scalar struct" << std::endl;
          out << "# ndims: 2" << std::endl;
          out << "  1 1" << std::endl;
          out << "# length: " << list.size() << std::endl;
        }

        // store all children
        for (size_t i=0; i<list.size(); i++)
        {
          list[i]->saveOctave(out);
        }

        out << std::endl;
        out << std::endl;
      }
      else if (name.size() > 0 && value.size() > 0)
      {
        char *vp=0;
        std::strtod(value.c_str(), &vp);

        if (*vp == '\0')
        {
          // store scalar
          out << "# name: " << name << std::endl;
          out << "# type: scalar" << std::endl;
          out << value << std::endl;
          out << std::endl;
          out << std::endl;
        }
        else
        {
          try
          {
            gmath::Matrixd M;
            std::istringstream in(value);
            in >> M;

            if (M.rows() > 0 && M.cols() > 0)
            {
              if (M.rows() == 1)
              {
                // store vector always as column
                gmath::Matrixd tmp=M;
                M=gmath::transpose(tmp);
              }

              // store matrix
              out << "# name: " << name << std::endl;
              out << "# type: matrix" << std::endl;
              out << "# rows: " << M.rows() << std::endl;
              out << "# columns: " << M.cols() << std::endl;
              out.precision(16);

              for (int k=0; k<M.rows(); k++)
              {
                for (int i=0; i<M.cols(); i++)
                {
                  out << ' ' << M(k, i);
                }

                out << std::endl;
              }

              out << std::endl;
              out << std::endl;
            }
          }
          catch (...)
          { }
        }
      }
    }